

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void sndio_destroy(cubeb_conflict2 *context)

{
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 8) != 0) {
    dlclose(*(undefined8 *)((long)in_RDI + 8));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
sndio_destroy(cubeb * context)
{
  DPR("sndio_destroy()\n");
#ifndef DISABLE_LIBSNDIO_DLOPEN
  if (context->libsndio)
    dlclose(context->libsndio);
#endif
  free(context);
}